

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O3

void __thiscall
ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  undefined4 in_ECX;
  int iVar4;
  undefined1 auVar5 [16];
  double dVar6;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  AssertionResult local_28;
  char *local_18 [2];
  
  dVar1 = *pica::ParticleTypes::types;
  dVar6 = dVar1 * 29979245800.0;
  auVar5._8_8_ = dVar6;
  auVar5._0_8_ = dVar6;
  auVar5 = divpd(_DAT_001c7490,auVar5);
  auVar2._8_8_ = -(ulong)(!NAN((431.124 / dVar6) * 29979245800.0 * dVar1) &&
                         !NAN(dVar1 * auVar5._8_8_ * 29979245800.0));
  auVar2._0_8_ = -(ulong)(!NAN(dVar1) && !NAN(dVar1 * auVar5._0_8_ * 29979245800.0));
  iVar4 = movmskpd(in_ECX,auVar2);
  if ((iVar4 != 3) || (NAN(pica::ParticleTypes::types[1]))) {
    local_28.success_ = false;
    local_28.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)local_18,&local_28,"this->eqParticles_(particle, copyParticle)","false",
               "true");
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x70,local_18[0]);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_18[0] != (char *)0x0) {
      operator_delete__(local_18[0]);
    }
    if (((local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_38.ptr_ + 8))();
    }
  }
  else {
    local_28.success_ = true;
    local_28.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Assignment)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(432.453, -3452.15, -15.125);
    MomentumType momentum(431.124, -54.12, 5643.176);
    FactorType factor = 1.9945;
    ParticleType particle(position, momentum, factor, 0);
    ParticleType copyParticle;
    copyParticle = particle;
    ASSERT_TRUE(this->eqParticles_(particle, copyParticle));
}